

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O3

void ParseEntity(TidyDocImpl *doc,GetTokenMode mode)

{
  long lVar1;
  uint *puVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  Bool BVar7;
  uint uVar8;
  uint uVar9;
  ulong extraout_RAX;
  void *pvVar11;
  ulong uVar12;
  GetTokenMode GVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  Lexer *lexer;
  ulong uVar17;
  bool bVar18;
  char cVar19;
  uint ch;
  uint entver;
  uint local_8c;
  GetTokenMode local_88;
  tchar local_84;
  Lexer *local_80;
  void *local_78;
  undefined4 local_70;
  uint local_6c;
  uint local_68;
  int local_64;
  uint local_60;
  uint local_5c;
  Lexer *local_58;
  ulong local_50;
  ulong local_48;
  Bool local_3c;
  ulong local_38;
  ulong uVar10;
  
  local_50 = (ulong)*(uint *)((doc->config).value + 0x40);
  local_78 = (void *)CONCAT44(local_78._4_4_,*(undefined4 *)((doc->config).value + 0x67));
  local_68 = 0;
  local_80 = doc->lexer;
  local_38 = (ulong)local_80->lexsize;
  local_6c = local_80->lexsize - 1;
  local_5c = doc->docIn->curcol - 1;
  uVar12 = 0;
  local_88 = mode;
LAB_0014a74d:
  uVar17 = uVar12;
  do {
    uVar4 = prvTidyReadChar(doc->docIn);
    uVar10 = (ulong)uVar4;
    if (uVar4 == 0xffffffff) {
LAB_0014a83a:
      local_70 = (undefined4)CONCAT71((int7)(uVar10 >> 8),1);
LAB_0014a840:
      lexer = local_80;
      local_80->lexbuf[local_80->lexsize] = '\0';
      uVar12 = (ulong)local_6c;
      iVar6 = prvTidytmbstrcmp(local_80->lexbuf + uVar12,"&apos");
      GVar13 = local_88;
      if ((((iVar6 == 0) && (*(int *)((doc->config).value + 100) == 0)) && (lexer->isvoyager == no))
         && ((*(int *)((doc->config).value + 0x62) == 0 &&
             (iVar6 = prvTidyHTMLVersion(doc), iVar6 != 0x20000)))) {
        prvTidyReportEntityError(doc,0x225,lexer->lexbuf + uVar12,0x27);
      }
      if (uVar4 == 0x3b && GVar13 == OtherNamespace) {
        local_8c = 0xff;
        local_68 = 0x60000;
        cVar19 = '\0';
        goto LAB_0014ac89;
      }
      BVar7 = prvTidyEntityInfo(lexer->lexbuf + uVar12,(Bool)local_78,&local_8c,&local_68);
      cVar19 = local_50 == 0;
      if ((!(bool)cVar19) || (BVar7 == no)) goto LAB_0014abfd;
      local_50 = (ulong)(byte)cVar19;
      local_3c = BVar7;
      BVar7 = prvTidyIsLowSurrogate(local_8c);
      if (BVar7 == no) {
        BVar7 = prvTidyIsHighSurrogate(local_8c);
        cVar19 = (char)local_50;
        if (BVar7 == no) goto LAB_0014ac89;
        uVar9 = 0x22e;
      }
      else {
        uVar9 = prvTidyReadChar(doc->docIn);
        if (uVar9 == 0x26) {
          local_60 = local_8c;
          local_58 = doc->lexer;
          local_48 = uVar12;
          if ((local_58 == (Lexer *)0x0) ||
             (pvVar11 = (*local_58->allocator->vtbl->realloc)(local_58->allocator,(void *)0x0,0x20),
             pvVar11 == (void *)0x0)) goto LAB_0014ac58;
          uVar12 = 0x20;
          uVar8 = 0;
          iVar6 = 0;
          goto LAB_0014a995;
        }
        prvTidyUngetChar(uVar9,doc->docIn);
        uVar9 = 0x230;
      }
      prvTidyReportSurrogateError(doc,uVar9,local_8c,0);
      local_8c = 0xfffd;
      cVar19 = '\x01';
      goto LAB_0014ac89;
    }
    if (uVar4 == 0x3b) {
      local_70 = 0;
      goto LAB_0014a840;
    }
    iVar6 = (int)uVar17;
    if (uVar4 == 0x23 && iVar6 == 0) {
      if ((*(int *)((doc->config).value + 0x38) == 0) ||
         (((doc->config).value[0x22].v & 0xfffffffffffffffe) == 0xc)) {
        prvTidyUngetChar(0x23,doc->docIn);
        return;
      }
      uVar17 = 1;
      uVar4 = 0x23;
      goto LAB_0014a814;
    }
    if (iVar6 == 1 && (int)uVar12 == 1) {
      uVar17 = 2;
      if (uVar4 == 0x78) {
        uVar4 = 0x78;
        goto LAB_0014a814;
      }
      if (uVar4 == 0x58 && (Bool)local_78 == 0) break;
    }
    iVar5 = (*(code *)(&PTR_prvTidyIsNamechar_001cf6a0)[uVar12])(uVar4);
    if (iVar5 == 0) {
      prvTidyUngetChar(uVar4,doc->docIn);
      uVar10 = extraout_RAX;
      goto LAB_0014a83a;
    }
    prvTidyAddCharToLexer(local_80,uVar4);
    uVar17 = (ulong)(iVar6 + 1);
  } while( true );
  uVar4 = 0x58;
LAB_0014a814:
  prvTidyAddCharToLexer(local_80,uVar4);
  uVar12 = uVar17;
  goto LAB_0014a74d;
  while (uVar8 = 1, iVar6 = local_64, uVar9 == 0x23) {
LAB_0014a995:
    local_64 = iVar6;
    uVar16 = uVar8;
    uVar17 = (ulong)uVar16;
    uVar9 = prvTidyReadChar(doc->docIn);
    if ((uVar9 == 0xffffffff) || (uVar9 == 0x3b)) goto LAB_0014ab1f;
    if ((uint)uVar12 < uVar16 + 2) {
      uVar12 = (ulong)((uint)uVar12 * 2);
      pvVar11 = (*local_58->allocator->vtbl->realloc)(local_58->allocator,pvVar11,uVar12);
      if (pvVar11 == (void *)0x0) {
        pvVar11 = (void *)0x0;
        goto LAB_0014ab1f;
      }
    }
    *(char *)((long)pvVar11 + uVar17) = (char)uVar9;
    if (uVar16 != 0) {
      uVar8 = uVar16 + 1;
      if (uVar16 == 1) {
        iVar6 = 1;
        if ((uVar9 == 0x78) || (uVar9 == 0x58 && (Bool)local_78 == 0)) goto LAB_0014a995;
      }
      GVar13 = local_88;
      if (local_64 == 0) {
        if (uVar9 < 0x80) {
          iVar6 = 0;
          if ((lexmap[uVar9] & 1) == 0) {
            uVar16 = uVar16 + 1;
            if (uVar9 != 0x3b) goto LAB_0014ac11;
            *(undefined1 *)((long)pvVar11 + (ulong)uVar16) = 0;
            goto LAB_0014ab51;
          }
          goto LAB_0014a995;
        }
      }
      else if (uVar9 < 0x80) {
        iVar6 = 1;
        if ((lexmap[uVar9] & 0x80) == 0) {
          uVar17 = (ulong)(uVar16 + 1);
          goto LAB_0014ab1f;
        }
        goto LAB_0014a995;
      }
      uVar16 = uVar16 + 1;
      goto LAB_0014ac11;
    }
  }
  uVar17 = 1;
LAB_0014ab1f:
  uVar16 = (uint)uVar17;
  GVar13 = local_88;
  if (uVar9 == 0x3b) {
    *(undefined1 *)((long)pvVar11 + uVar17) = 0;
    if (local_64 == 0) {
LAB_0014ab51:
      lVar15 = (long)pvVar11 + 1;
      pcVar14 = "%d";
      local_78 = pvVar11;
    }
    else {
      lVar15 = (long)pvVar11 + 2;
      pcVar14 = "%x";
      local_78 = pvVar11;
    }
    uVar12 = local_48;
    GVar13 = local_88;
    __isoc99_sscanf(lVar15,pcVar14,&local_84);
    BVar7 = prvTidyIsHighSurrogate(local_84);
    uVar9 = local_60;
    if (BVar7 == no) {
      prvTidyUngetChar(0x3b,doc->docIn);
      pvVar11 = local_78;
      goto LAB_0014ac11;
    }
    local_84 = prvTidyCombineSurrogatePair(local_84,local_60);
    BVar7 = prvTidyIsValidCombinedChar(local_84);
    if (BVar7 == no) {
      local_8c = 0xfffd;
      prvTidyReportSurrogateError(doc,0x22f,uVar9,local_84);
    }
    else {
      local_8c = local_84;
    }
    lexer = local_80;
    (*local_58->allocator->vtbl->free)(local_58->allocator,local_78);
    BVar7 = local_3c;
    cVar19 = (char)local_50;
LAB_0014abfd:
    if (BVar7 == no) goto LAB_0014acb1;
  }
  else {
LAB_0014ac11:
    if ((pvVar11 == (void *)0x0) || (uVar16 == 0)) {
      if (pvVar11 != (void *)0x0) goto LAB_0014ac46;
    }
    else {
      if (-1 < (int)(uVar16 - 1)) {
        uVar12 = (ulong)(uVar16 - 1);
        do {
          prvTidyUngetChar((int)*(char *)((long)pvVar11 + uVar12),doc->docIn);
          bVar18 = uVar12 != 0;
          uVar12 = uVar12 - 1;
        } while (bVar18);
      }
LAB_0014ac46:
      (*local_58->allocator->vtbl->free)(local_58->allocator,pvVar11);
    }
LAB_0014ac58:
    prvTidyReportSurrogateError(doc,0x230,local_60,0);
    prvTidyUngetChar(0x26,doc->docIn);
    uVar12 = local_48;
    lexer = local_80;
    cVar19 = '\x01';
  }
LAB_0014ac89:
  if (((local_8c & 0xffffffe0) != 0x80) && (uVar4 == 0x3b || local_8c < 0x100)) {
    if (uVar4 != 0x3b) {
      lexer->lines = doc->docIn->curline;
      lexer->columns = local_5c;
      prvTidyReportEntityError(doc,0x260,lexer->lexbuf + uVar12,uVar4);
      GVar13 = local_88;
    }
    if (cVar19 == '\0') {
      prvTidyAddCharToLexer(lexer,0x3b);
    }
    else {
      lexer->lexsize = local_6c;
      if (GVar13 == Preformatted && local_8c == 0xa0) {
        local_8c = 0x20;
      }
      prvTidyAddCharToLexer(lexer,local_8c);
      if ((local_8c == 0x26) && (*(int *)((doc->config).value + 0x45) == 0)) {
        bVar3 = 0x61;
        lVar15 = 0;
        do {
          lVar1 = lVar15 + 1;
          prvTidyAddCharToLexer(lexer,(uint)bVar3);
          bVar3 = anon_var_dwarf_52e8d[lVar15 + 0x2c];
          lVar15 = lVar1;
        } while (lVar1 != 4);
      }
    }
    puVar2 = &doc->lexer->versions;
    *puVar2 = *puVar2 & (local_68 | 0xe000);
    return;
  }
LAB_0014acb1:
  lexer->lines = doc->docIn->curline;
  lexer->columns = local_5c;
  if ((uint)local_38 < lexer->lexsize) {
    if ((local_8c & 0xffffffe0) == 0x80) {
      uVar9 = prvTidyDecodeWin1252(local_8c);
      if (uVar4 != 0x3b) {
        prvTidyReportEntityError(doc,0x25f,lexer->lexbuf + uVar12,uVar4);
      }
      prvTidyReportEncodingError(doc,0x249,local_8c,(uint)(uVar9 == 0));
      lexer->lexsize = local_6c;
      if (uVar9 == 0) {
        return;
      }
    }
    else {
      prvTidyReportEntityError(doc,0x28d,lexer->lexbuf + uVar12,local_8c);
      if ((char)local_70 != '\0') {
        return;
      }
      uVar9 = 0x3b;
    }
    prvTidyAddCharToLexer(lexer,uVar9);
  }
  else {
    iVar6 = prvTidyHTMLVersion(doc);
    if (iVar6 != 0x20000) {
      prvTidyReportEntityError(doc,0x282,lexer->lexbuf + uVar12,local_8c);
    }
  }
  return;
}

Assistant:

static void ParseEntity( TidyDocImpl* doc, GetTokenMode mode )
{
    typedef enum
    {
        ENT_default,
        ENT_numdec,
        ENT_numhex
    } ENTState;
    
    typedef Bool (*ENTfn)(uint);
    const ENTfn entFn[] = {
        TY_(IsNamechar),
        TY_(IsDigit),
        IsDigitHex
    };
    uint start;
    ENTState entState = ENT_default;
    uint charRead = 0;
    Bool semicolon = no, found = no;
    Bool isXml = cfgBool( doc, TidyXmlTags );
    Bool preserveEntities = cfgBool( doc, TidyPreserveEntities );
    uint c, ch, startcol, entver = 0;
    Lexer* lexer = doc->lexer;

    start = lexer->lexsize - 1;  /* to start at "&" */
    startcol = doc->docIn->curcol - 1;

    while ( (c = TY_(ReadChar)(doc->docIn)) != EndOfStream )
    {
        if ( c == ';' )
        {
            semicolon = yes;
            break;
        }
        ++charRead;

        if (charRead == 1 && c == '#')
        {
            if ( !cfgBool(doc, TidyNCR) ||
                 cfg(doc, TidyInCharEncoding) == BIG5 ||
                 cfg(doc, TidyInCharEncoding) == SHIFTJIS )
            {
                TY_(UngetChar)('#', doc->docIn);
                return;
            }

            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numdec;
            continue;
        }
        else if (charRead == 2 && entState == ENT_numdec
                 && (c == 'x' || (!isXml && c == 'X')) )
        {
            TY_(AddCharToLexer)( lexer, c );
            entState = ENT_numhex;
            continue;
        }

        if ( entFn[entState](c) )
        {
            TY_(AddCharToLexer)( lexer, c );
            continue;
        }

        /* otherwise put it back */
        TY_(UngetChar)( c, doc->docIn );
        break;
    }

    /* make sure entity is NULL terminated */
    lexer->lexbuf[lexer->lexsize] = '\0';

    /* Should contrain version to XML/XHTML if &apos; 
    ** is encountered.  But this is not possible with
    ** Tidy's content model bit mask.
    */
    if ( TY_(tmbstrcmp)(lexer->lexbuf+start, "&apos") == 0
         && !cfgBool(doc, TidyXmlOut)
         && !lexer->isvoyager
         && !cfgBool(doc, TidyXhtmlOut)
         && !(TY_(HTMLVersion)(doc) == HT50) ) /* Issue #239 - no warning if in HTML5++ mode */
        TY_(ReportEntityError)( doc, APOS_UNDEFINED, lexer->lexbuf+start, 39 );

    if (( mode == OtherNamespace ) && ( c == ';' ))
    {
        /* #130 MathML attr and entity fix! */
        found = yes;
        ch = 255;
        entver = XH50|HT50;
        preserveEntities = yes;
    }
    else
    {
        /* Lookup entity code and version
        */
        found = TY_(EntityInfo)( lexer->lexbuf+start, isXml, &ch, &entver );
    }

    /* Issue #483 - Deal with 'surrogate pairs' */
    /* TODO: Maybe warning/error, like found a leading surrogate
       but no following surrogate! Maybe should avoid outputting
       invalid utf-8 for this entity - maybe substitute?  */
    if (!preserveEntities && found && TY_(IsLowSurrogate)(ch))
    {
        uint c1;
        if ((c1 = TY_(ReadChar)(doc->docIn)) == '&')
        {
            SPStatus status;
            /* Have a following entity, 
               so there is a chance of having a valid surrogate pair */
            c1 = ch;    /* keep first value, in case of error */
            status = GetSurrogatePair(doc, isXml, &ch);
            if (status == SP_error)
            {
                TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, c1, 0); /* SP WARNING: - using substitute character */
                TY_(UngetChar)('&', doc->docIn);  /* otherwise put it back */
            }
        }
        else
        {
            /* put this non-entity lead char back */
            TY_(UngetChar)(c1, doc->docIn);
            /* Have leading surrogate pair, with no tail */
            TY_(ReportSurrogateError)(doc, BAD_SURROGATE_TAIL, ch, 0); /* SP WARNING: - using substitute character */
            ch = 0xFFFD;
        }
    } 
    else if (!preserveEntities && found && TY_(IsHighSurrogate)(ch))
    {
        /* Have trailing surrogate pair, with no lead */
        TY_(ReportSurrogateError)(doc, BAD_SURROGATE_LEAD, ch, 0); /* SP WARNING: - using substitute character */
        ch = 0xFFFD;
    }

    /* deal with unrecognized or invalid entities */
    /* #433012 - fix by Randy Waki 17 Feb 01 */
    /* report invalid NCR's - Terry Teague 01 Sep 01 */
    if ( !found || (ch >= 128 && ch <= 159) || (ch >= 256 && c != ';') )
    {
        /* set error position just before offending character */
        SetLexerLocus( doc, lexer );
        lexer->columns = startcol;

        if (lexer->lexsize > start + 1)
        {
            if (ch >= 128 && ch <= 159)
            {
                /* invalid numeric character reference */
                
                uint c1 = 0;
                int replaceMode = DISCARDED_CHAR;
            
                /* Always assume Win1252 in this circumstance. */
                c1 = TY_(DecodeWin1252)( ch );

                if ( c1 )
                    replaceMode = REPLACED_CHAR;
                
                if ( c != ';' )  /* issue warning if not terminated by ';' */
                    TY_(ReportEntityError)( doc, MISSING_SEMICOLON_NCR,
                                            lexer->lexbuf+start, c );
 
                TY_(ReportEncodingError)(doc, INVALID_NCR, ch, replaceMode == DISCARDED_CHAR);
                
                if ( c1 )
                {
                    /* make the replacement */
                    lexer->lexsize = start;
                    TY_(AddCharToLexer)( lexer, c1 );
                    semicolon = no;
                }
                else
                {
                    /* discard */
                    lexer->lexsize = start;
                    semicolon = no;
               }
               
            }
            else
                TY_(ReportEntityError)( doc, UNKNOWN_ENTITY,
                                        lexer->lexbuf+start, ch );

            if (semicolon)
                TY_(AddCharToLexer)( lexer, ';' );
        }
        else
        {
            /*\ 
             *  Issue #207 - A naked & is allowed in HTML5, as an unambiguous ampersand!
            \*/
            if (TY_(HTMLVersion)(doc) != HT50) 
            {
                TY_(ReportEntityError)( doc, UNESCAPED_AMPERSAND,
                                    lexer->lexbuf+start, ch );
            }
        }
    }
    else
    {
        if ( c != ';' )    /* issue warning if not terminated by ';' */
        {
            /* set error position just before offending chararcter */
            SetLexerLocus( doc, lexer );
            lexer->columns = startcol;
            TY_(ReportEntityError)( doc, MISSING_SEMICOLON, lexer->lexbuf+start, c );
        }

        if (preserveEntities)
            TY_(AddCharToLexer)( lexer, ';' );
        else
        {
            lexer->lexsize = start;
            if ( ch == 160 && (mode == Preformatted) )
                ch = ' ';
            TY_(AddCharToLexer)( lexer, ch );

            if ( ch == '&' && !cfgBool(doc, TidyQuoteAmpersand) )
                AddStringToLexer( lexer, "amp;" );
        }

        /* Detect extended vs. basic entities */
        TY_(ConstrainVersion)( doc, entver );
    }
}